

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O0

int dice_roll(dice_t *dice,random_value *v)

{
  int iVar1;
  undefined1 local_28 [8];
  random_value rv;
  random_value *v_local;
  dice_t *dice_local;
  
  rv._8_8_ = v;
  dice_random_value(dice,(random_value *)local_28);
  if (rv._8_8_ != 0) {
    *(undefined4 *)rv._8_8_ = local_28._0_4_;
    *(undefined4 *)(rv._8_8_ + 4) = local_28._4_4_;
    *(int *)(rv._8_8_ + 8) = rv.base;
    *(int *)(rv._8_8_ + 0xc) = rv.dice;
  }
  iVar1 = damroll(local_28._4_4_,rv.base);
  return local_28._0_4_ + iVar1;
}

Assistant:

int dice_roll(const dice_t *dice, random_value *v)
{
	random_value rv;
	dice_random_value(dice, &rv);

	if (v != NULL) {
		v->base = rv.base;
		v->dice = rv.dice;
		v->sides = rv.sides;
		v->m_bonus = rv.m_bonus;
	}

	return rv.base + damroll(rv.dice, rv.sides);
}